

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printTestRun(TestOutput *this,size_t number,size_t total)

{
  ulong in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  
  if (1 < in_RDX) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,"Test run ");
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_RSI);
    (**(code **)(*in_RDI + 0x58))(in_RDI," of ");
    (**(code **)(*in_RDI + 0x68))(in_RDI,in_RDX);
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\n");
  }
  return;
}

Assistant:

void TestOutput::printTestRun(size_t number, size_t total)
{
    if (total > 1) {
        print("Test run ");
        print(number);
        print(" of ");
        print(total);
        print("\n");
    }
}